

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_fixture.c
# Opt level: O0

int test_auth_keyboard(LIBSSH2_SESSION *session,int flags,char *username,char *password)

{
  int iVar1;
  size_t sVar2;
  char *__haystack;
  char *pcVar3;
  char *userauth_list;
  int rc;
  char *password_local;
  char *username_local;
  int flags_local;
  LIBSSH2_SESSION *session_local;
  
  sVar2 = strlen(username);
  __haystack = (char *)libssh2_userauth_list(session,username,sVar2 & 0xffffffff);
  if (__haystack == (char *)0x0) {
    print_last_session_error("libssh2_userauth_list");
    session_local._4_4_ = 1;
  }
  else {
    pcVar3 = strstr(__haystack,"keyboard-interactive");
    if (pcVar3 == (char *)0x0) {
      fprintf(_stderr,"\'keyboard-interactive\' was expected in userauth list: %s\n",__haystack);
      session_local._4_4_ = 1;
    }
    else {
      kbd_password = password;
      sVar2 = strlen(username);
      iVar1 = libssh2_userauth_keyboard_interactive_ex
                        (session,username,sVar2 & 0xffffffff,kbd_callback);
      kbd_password = (char *)0x0;
      if ((flags & 1U) == 0) {
        if (iVar1 != 0) {
          print_last_session_error("libssh2_userauth_keyboard_interactive_ex");
          return 1;
        }
      }
      else if (iVar1 == 0) {
        fprintf(_stderr,"Keyboard-interactive auth succeeded with wrong response\n");
        return 1;
      }
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

int test_auth_keyboard(LIBSSH2_SESSION *session, int flags,
                       const char *username,
                       const char *password)
{
    int rc;

    const char *userauth_list =
        libssh2_userauth_list(session, username,
                              (unsigned int)strlen(username));
    if(!userauth_list) {
        print_last_session_error("libssh2_userauth_list");
        return 1;
    }

    if(!strstr(userauth_list, "keyboard-interactive")) {
        fprintf(stderr,
                "'keyboard-interactive' was expected in userauth list: %s\n",
                userauth_list);
        return 1;
    }

    kbd_password = password;

    rc = libssh2_userauth_keyboard_interactive_ex(session, username,
                                                (unsigned int)strlen(username),
                                                  kbd_callback);

    kbd_password = NULL;

    if((flags & TEST_AUTH_SHOULDFAIL) != 0) {
        if(rc == 0) {
            fprintf(stderr, "Keyboard-interactive auth succeeded "
                            "with wrong response\n");
            return 1;
        }
    }
    else {
        if(rc) {
            print_last_session_error(
                "libssh2_userauth_keyboard_interactive_ex");
            return 1;
        }
    }

    return 0;
}